

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O2

bool __thiscall gl3cts::SparseBuffersWithCopyOpsTest::initTest(SparseBuffersWithCopyOpsTest *this)

{
  ostringstream *this_00;
  long lVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  uchar *__s;
  uint uVar5;
  undefined1 local_1b0 [384];
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x868))(0x82f8,&this->m_page_size);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_SPARSE_BUFFER_PAGE_SIZE_ARB query",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                  ,0x15c9);
  lVar1 = *(long *)(lVar4 + 0x158);
  if (lVar1 == 0) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,
                    "Could not retrieve function pointer for the glBufferPageCommitmentARB() entry-point."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  else {
    (**(code **)(lVar4 + 0x6c8))(1,&this->m_bo_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glGenBuffers() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x15d8);
    (**(code **)(lVar4 + 0x40))(0x8892,this->m_bo_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glBindBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x15db);
    (**(code **)(lVar4 + 0x160))(0x8892,this->m_virtual_bo_size,0,0x500);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glBufferStorage() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x15df);
    uVar5 = this->m_n_pages_to_test * this->m_page_size & 0xfffffff0;
    this->m_result_data_storage_size = uVar5;
    __s = (uchar *)operator_new__((ulong)uVar5);
    this->m_clear_buffer = __s;
    memset(__s,0,(ulong)uVar5);
    (**(code **)(lVar4 + 0x6c8))(1,&this->m_bo_read_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glGenBuffers() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x15e9);
    (**(code **)(lVar4 + 0x40))(0x8893,this->m_bo_read_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glBindBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x15ec);
    (**(code **)(lVar4 + 0x160))(0x8893,this->m_result_data_storage_size,0,0x101);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glBufferStorage() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x15f0);
  }
  return lVar1 != 0;
}

Assistant:

bool SparseBuffersWithCopyOpsTest::initTest()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Retrieve the platform-specific page size */
	gl.getIntegerv(GL_SPARSE_BUFFER_PAGE_SIZE_ARB, &m_page_size);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_SPARSE_BUFFER_PAGE_SIZE_ARB query");

	/* Retrieve the func ptr */
	if (gl.bufferPageCommitmentARB == NULL)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Could not retrieve function pointer for the glBufferPageCommitmentARB() entry-point."
						   << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Set up the test sparse buffer object */
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bufferStorage(GL_ARRAY_BUFFER, m_virtual_bo_size, DE_NULL, /* data */
					 GL_DYNAMIC_STORAGE_BIT | GL_SPARSE_STORAGE_BIT_ARB);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferStorage() call failed.");

	/* Set up the buffer object that will be used to read the result data */
	m_result_data_storage_size = static_cast<unsigned int>(
		(m_page_size * m_n_pages_to_test / sizeof(m_reference_data)) * sizeof(m_reference_data));
	m_clear_buffer = new unsigned char[m_result_data_storage_size];

	memset(m_clear_buffer, 0, m_result_data_storage_size);

	gl.genBuffers(1, &m_bo_read_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_bo_read_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bufferStorage(GL_ELEMENT_ARRAY_BUFFER, m_result_data_storage_size, NULL, /* data */
					 GL_DYNAMIC_STORAGE_BIT | GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferStorage() call failed.");

end:
	return result;
}